

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O2

unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_> __thiscall
wabt::MakeUnique<wabt::MemoryModuleField,wabt::Location&,std::__cxx11::string&>
          (wabt *this,Location *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  string_view name;
  MemoryModuleField *this_00;
  
  this_00 = (MemoryModuleField *)operator_new(0x78);
  name.data_ = (args_1->_M_dataplus)._M_p;
  name.size_ = args_1->_M_string_length;
  MemoryModuleField::MemoryModuleField(this_00,args,name);
  *(MemoryModuleField **)this = this_00;
  return (__uniq_ptr_data<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>,_true,_true>
          )(__uniq_ptr_data<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}